

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBootstrapCommands2.cxx
# Opt level: O0

void GetBootstrapCommands2(vector<cmCommand_*,_std::allocator<cmCommand_*>_> *commands)

{
  vector<cmCommand_*,_std::allocator<cmCommand_*>_> *pvVar1;
  value_type pcVar2;
  cmGetPropertyCommand *this;
  cmInstallCommand *this_00;
  cmInstallFilesCommand *this_01;
  cmSetPropertyCommand *this_02;
  cmTargetLinkLibrariesCommand *this_03;
  cmTryRunCommand *this_04;
  value_type local_158;
  value_type local_150;
  cmTryRunCommand *local_148;
  value_type local_140;
  cmTargetLinkLibrariesCommand *local_138;
  value_type local_130;
  value_type local_128;
  value_type local_120;
  value_type local_118;
  value_type local_110;
  value_type local_108;
  value_type local_100;
  cmSetPropertyCommand *local_f8;
  value_type local_f0;
  value_type local_e8;
  value_type local_e0;
  value_type local_d8;
  value_type local_d0;
  value_type local_c8;
  value_type local_c0;
  value_type local_b8;
  value_type local_b0;
  value_type local_a8;
  value_type local_a0;
  value_type local_98;
  value_type local_90;
  value_type local_88;
  cmInstallFilesCommand *local_80;
  cmInstallCommand *local_78;
  value_type local_70;
  value_type local_68;
  value_type local_60;
  value_type local_58;
  value_type local_50;
  value_type local_48;
  cmGetPropertyCommand *local_40;
  value_type local_38;
  value_type local_30 [3];
  value_type local_18;
  vector<cmCommand_*,_std::allocator<cmCommand_*>_> *local_10;
  vector<cmCommand_*,_std::allocator<cmCommand_*>_> *commands_local;
  
  local_10 = commands;
  pcVar2 = (value_type)operator_new(0x50);
  cmGetCMakePropertyCommand::cmGetCMakePropertyCommand((cmGetCMakePropertyCommand *)pcVar2);
  local_18 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(commands,&local_18);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmGetDirectoryPropertyCommand::cmGetDirectoryPropertyCommand
            ((cmGetDirectoryPropertyCommand *)pcVar2);
  local_30[0] = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,local_30);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmGetFilenameComponentCommand::cmGetFilenameComponentCommand
            ((cmGetFilenameComponentCommand *)pcVar2);
  local_38 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_38);
  pvVar1 = local_10;
  this = (cmGetPropertyCommand *)operator_new(0xb8);
  cmGetPropertyCommand::cmGetPropertyCommand(this);
  local_40 = this;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_40);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmGetSourceFilePropertyCommand::cmGetSourceFilePropertyCommand
            ((cmGetSourceFilePropertyCommand *)pcVar2);
  local_48 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_48);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmGetTargetPropertyCommand::cmGetTargetPropertyCommand((cmGetTargetPropertyCommand *)pcVar2);
  local_50 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_50);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmIfCommand::cmIfCommand((cmIfCommand *)pcVar2);
  local_58 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_58);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmIncludeCommand::cmIncludeCommand((cmIncludeCommand *)pcVar2);
  local_60 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_60);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmIncludeDirectoryCommand::cmIncludeDirectoryCommand((cmIncludeDirectoryCommand *)pcVar2);
  local_68 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_68);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmIncludeRegularExpressionCommand::cmIncludeRegularExpressionCommand
            ((cmIncludeRegularExpressionCommand *)pcVar2);
  local_70 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_70);
  pvVar1 = local_10;
  this_00 = (cmInstallCommand *)operator_new(0x70);
  cmInstallCommand::cmInstallCommand(this_00);
  local_78 = this_00;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_78);
  pvVar1 = local_10;
  this_01 = (cmInstallFilesCommand *)operator_new(0xa8);
  cmInstallFilesCommand::cmInstallFilesCommand(this_01);
  local_80 = this_01;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_80);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmInstallTargetsCommand::cmInstallTargetsCommand((cmInstallTargetsCommand *)pcVar2);
  local_88 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_88);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmLinkDirectoriesCommand::cmLinkDirectoriesCommand((cmLinkDirectoriesCommand *)pcVar2);
  local_90 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_90);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmListCommand::cmListCommand((cmListCommand *)pcVar2);
  local_98 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_98);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmMacroCommand::cmMacroCommand((cmMacroCommand *)pcVar2);
  local_a0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_a0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmMakeDirectoryCommand::cmMakeDirectoryCommand((cmMakeDirectoryCommand *)pcVar2);
  local_a8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_a8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmMarkAsAdvancedCommand::cmMarkAsAdvancedCommand((cmMarkAsAdvancedCommand *)pcVar2);
  local_b0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_b0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmMathCommand::cmMathCommand((cmMathCommand *)pcVar2);
  local_b8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_b8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmMessageCommand::cmMessageCommand((cmMessageCommand *)pcVar2);
  local_c0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_c0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmOptionCommand::cmOptionCommand((cmOptionCommand *)pcVar2);
  local_c8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_c8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmProjectCommand::cmProjectCommand((cmProjectCommand *)pcVar2);
  local_d0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_d0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmReturnCommand::cmReturnCommand((cmReturnCommand *)pcVar2);
  local_d8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_d8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmSeparateArgumentsCommand::cmSeparateArgumentsCommand((cmSeparateArgumentsCommand *)pcVar2);
  local_e0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_e0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmSetCommand::cmSetCommand((cmSetCommand *)pcVar2);
  local_e8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_e8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmSetDirectoryPropertiesCommand::cmSetDirectoryPropertiesCommand
            ((cmSetDirectoryPropertiesCommand *)pcVar2);
  local_f0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_f0);
  pvVar1 = local_10;
  this_02 = (cmSetPropertyCommand *)operator_new(200);
  cmSetPropertyCommand::cmSetPropertyCommand(this_02);
  local_f8 = this_02;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_f8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmSetSourceFilesPropertiesCommand::cmSetSourceFilesPropertiesCommand
            ((cmSetSourceFilesPropertiesCommand *)pcVar2);
  local_100 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_100);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmSetTargetPropertiesCommand::cmSetTargetPropertiesCommand((cmSetTargetPropertiesCommand *)pcVar2)
  ;
  local_108 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_108);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmGetTestPropertyCommand::cmGetTestPropertyCommand((cmGetTestPropertyCommand *)pcVar2);
  local_110 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_110);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmSetTestsPropertiesCommand::cmSetTestsPropertiesCommand((cmSetTestsPropertiesCommand *)pcVar2);
  local_118 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_118);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmSiteNameCommand::cmSiteNameCommand((cmSiteNameCommand *)pcVar2);
  local_120 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_120);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmStringCommand::cmStringCommand((cmStringCommand *)pcVar2);
  local_128 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_128);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmSubdirCommand::cmSubdirCommand((cmSubdirCommand *)pcVar2);
  local_130 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_130);
  pvVar1 = local_10;
  this_03 = (cmTargetLinkLibrariesCommand *)operator_new(0x60);
  cmTargetLinkLibrariesCommand::cmTargetLinkLibrariesCommand(this_03);
  local_138 = this_03;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_138)
  ;
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0xb8);
  cmTryCompileCommand::cmTryCompileCommand((cmTryCompileCommand *)pcVar2);
  local_140 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_140);
  pvVar1 = local_10;
  this_04 = (cmTryRunCommand *)operator_new(0x158);
  cmTryRunCommand::cmTryRunCommand(this_04);
  local_148 = this_04;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_148)
  ;
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmUnsetCommand::cmUnsetCommand((cmUnsetCommand *)pcVar2);
  local_150 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_150);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmWhileCommand::cmWhileCommand((cmWhileCommand *)pcVar2);
  local_158 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_158);
  return;
}

Assistant:

void GetBootstrapCommands2(std::vector<cmCommand*>& commands)
{
  commands.push_back(new cmGetCMakePropertyCommand);
  commands.push_back(new cmGetDirectoryPropertyCommand);
  commands.push_back(new cmGetFilenameComponentCommand);
  commands.push_back(new cmGetPropertyCommand);
  commands.push_back(new cmGetSourceFilePropertyCommand);
  commands.push_back(new cmGetTargetPropertyCommand);
  commands.push_back(new cmIfCommand);
  commands.push_back(new cmIncludeCommand);
  commands.push_back(new cmIncludeDirectoryCommand);
  commands.push_back(new cmIncludeRegularExpressionCommand);
  commands.push_back(new cmInstallCommand);
  commands.push_back(new cmInstallFilesCommand);
  commands.push_back(new cmInstallTargetsCommand);
  commands.push_back(new cmLinkDirectoriesCommand);
  commands.push_back(new cmListCommand);
  commands.push_back(new cmMacroCommand);
  commands.push_back(new cmMakeDirectoryCommand);
  commands.push_back(new cmMarkAsAdvancedCommand);
  commands.push_back(new cmMathCommand);
  commands.push_back(new cmMessageCommand);
  commands.push_back(new cmOptionCommand);
  commands.push_back(new cmProjectCommand);
  commands.push_back(new cmReturnCommand);
  commands.push_back(new cmSeparateArgumentsCommand);
  commands.push_back(new cmSetCommand);
  commands.push_back(new cmSetDirectoryPropertiesCommand);
  commands.push_back(new cmSetPropertyCommand);
  commands.push_back(new cmSetSourceFilesPropertiesCommand);
  commands.push_back(new cmSetTargetPropertiesCommand);
  commands.push_back(new cmGetTestPropertyCommand);
  commands.push_back(new cmSetTestsPropertiesCommand);
  commands.push_back(new cmSiteNameCommand);
  commands.push_back(new cmStringCommand);
  commands.push_back(new cmSubdirCommand);
  commands.push_back(new cmTargetLinkLibrariesCommand);
  commands.push_back(new cmTryCompileCommand);
  commands.push_back(new cmTryRunCommand);
  commands.push_back(new cmUnsetCommand);
  commands.push_back(new cmWhileCommand);
}